

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::GetKeyPressedAmount(ImGuiKey key,float repeat_delay,float repeat_rate)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiKeyData *pIVar3;
  
  pIVar1 = GImGui;
  pIVar3 = GetKeyData(key);
  if (pIVar3->Down == true) {
    iVar2 = CalcTypematicRepeatAmount
                      (pIVar3->DownDuration - (pIVar1->IO).DeltaTime,pIVar3->DownDuration,
                       repeat_delay,repeat_rate);
    return iVar2;
  }
  return 0;
}

Assistant:

int ImGui::GetKeyPressedAmount(ImGuiKey key, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return 0;
    const float t = key_data->DownDuration;
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}